

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ComparisonTestTU<signed_char,long>(void)

{
  if (ComparisonTestTU<signed_char,long>()::b1 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  if (ComparisonTestTU<signed_char,long>()::b2 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  if (ComparisonTestTU<signed_char,long>()::b3 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  if (ComparisonTestTU<signed_char,long>()::b4 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  if (ComparisonTestTU<signed_char,long>()::b5 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  if (ComparisonTestTU<signed_char,long>()::b6 == '\0') {
    ComparisonTestTU<signed_char,long>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}